

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::
         FullClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,bool is_descriptor)

{
  Options options;
  Options local_40;
  
  local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header;
  local_40.is_descriptor = false;
  local_40.aggregate_metadata = false;
  local_40.gen_c_wkt = false;
  local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FullClassName<google::protobuf::Descriptor>(__return_storage_ptr__,desc,&local_40);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_40.aggregate_metadata_prefixes._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, bool is_descriptor) {
  Options options;
  options.is_descriptor = is_descriptor;
  return FullClassName(desc, options);
}